

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O1

Info * re2::Prefilter::Info::Alt(Info *a,Info *b)

{
  bool bVar1;
  Info *this;
  Prefilter *pPVar2;
  Prefilter *pPVar3;
  Info *pIVar4;
  
  this = (Info *)operator_new(0x40);
  Info(this);
  if (a->is_exact_ == true) {
    if (b->is_exact_ == true) {
      pIVar4 = b;
      if ((a->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count <
          (b->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        pIVar4 = a;
        a = b;
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,&a->exact_);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,re2::Prefilter::LengthThenLex,std::allocator<std::__cxx11::string>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,re2::Prefilter::LengthThenLex,std::allocator<std::__cxx11::string>>
                  *)this,(pIVar4->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )&(pIVar4->exact_)._M_t._M_impl.super__Rb_tree_header);
      bVar1 = true;
      b = pIVar4;
      goto LAB_0012aa99;
    }
    pPVar2 = OrStrings(&a->exact_);
    a->match_ = pPVar2;
    a->is_exact_ = false;
  }
  pPVar2 = a->match_;
  a->match_ = (Prefilter *)0x0;
  if (b->is_exact_ == true) {
    pPVar3 = OrStrings(&b->exact_);
    b->match_ = pPVar3;
    b->is_exact_ = false;
  }
  pPVar3 = b->match_;
  b->match_ = (Prefilter *)0x0;
  pPVar2 = AndOr(OR,pPVar2,pPVar3);
  this->match_ = pPVar2;
  bVar1 = false;
LAB_0012aa99:
  this->is_exact_ = bVar1;
  if (a != (Info *)0x0) {
    ~Info(a);
    operator_delete(a);
  }
  if (b != (Info *)0x0) {
    ~Info(b);
    operator_delete(b);
  }
  return this;
}

Assistant:

Prefilter::Info* Prefilter::Info::Alt(Info* a, Info* b) {
  Info *ab = new Info();

  if (a->is_exact_ && b->is_exact_) {
    // Avoid string copies by moving the larger exact_ set into
    // ab directly, then merge in the smaller set.
    if (a->exact_.size() < b->exact_.size()) {
      using std::swap;
      swap(a, b);
    }
    ab->exact_ = std::move(a->exact_);
    ab->exact_.insert(b->exact_.begin(), b->exact_.end());
    ab->is_exact_ = true;
  } else {
    // Either a or b has is_exact_ = false. If the other
    // one has is_exact_ = true, we move it to match_ and
    // then create a OR of a,b. The resulting Info has
    // is_exact_ = false.
    ab->match_ = Prefilter::Or(a->TakeMatch(), b->TakeMatch());
    ab->is_exact_ = false;
  }

  delete a;
  delete b;
  return ab;
}